

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

int helicsGetOptionValue(char *val)

{
  int iVar1;
  size_t sVar2;
  string local_38;
  
  if (val == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar2 = strlen(val);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,val,val + sVar2);
    iVar1 = helics::getOptionValue(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar1;
}

Assistant:

int helicsGetOptionValue(const char* val)
{
    if (val == nullptr) {
        return -1;
    }
    return helics::getOptionValue(val);
}